

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

_Bool realloc_array(roaring_array_t *ra,int32_t new_capacity)

{
  void **__dest;
  uint8_t *__dest_00;
  void **__src;
  void **__dest_01;
  long lVar1;
  
  if (new_capacity == 0) {
    roaring_free(ra->containers);
    ra->keys = (uint16_t *)0x0;
    ra->typecodes = (uint8_t *)0x0;
    *(undefined8 *)&ra->allocation_size = 0;
    *(undefined8 *)((long)&ra->containers + 4) = 0;
  }
  else {
    lVar1 = (long)new_capacity;
    __dest_01 = (void **)roaring_malloc(lVar1 * 0xb);
    if (__dest_01 == (void **)0x0) {
      return false;
    }
    __src = ra->containers;
    __dest = __dest_01 + lVar1;
    __dest_00 = (uint8_t *)((long)__dest + lVar1 * 2);
    if (0 < (long)ra->size) {
      memcpy(__dest_01,__src,(long)ra->size << 3);
      memcpy(__dest,ra->keys,(long)ra->size * 2);
      memcpy(__dest_00,ra->typecodes,(long)ra->size);
    }
    ra->containers = __dest_01;
    ra->keys = (uint16_t *)__dest;
    ra->typecodes = __dest_00;
    ra->allocation_size = new_capacity;
    roaring_free(__src);
  }
  return true;
}

Assistant:

static bool realloc_array(roaring_array_t *ra, int32_t new_capacity) {
    //
    // Note: not implemented using C's realloc(), because the memory layout is
    // Struct-of-Arrays vs. Array-of-Structs:
    // https://github.com/RoaringBitmap/CRoaring/issues/256

    if (new_capacity == 0) {
        roaring_free(ra->containers);
        ra->containers = NULL;
        ra->keys = NULL;
        ra->typecodes = NULL;
        ra->allocation_size = 0;
        return true;
    }
    const size_t memoryneeded =
        new_capacity *
        (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t));
    void *bigalloc = roaring_malloc(memoryneeded);
    if (!bigalloc) return false;
    void *oldbigalloc = ra->containers;
    container_t **newcontainers = (container_t **)bigalloc;
    uint16_t *newkeys = (uint16_t *)(newcontainers + new_capacity);
    uint8_t *newtypecodes = (uint8_t *)(newkeys + new_capacity);
    assert((char *)(newtypecodes + new_capacity) ==
           (char *)bigalloc + memoryneeded);
    if (ra->size > 0) {
        memcpy(newcontainers, ra->containers, sizeof(container_t *) * ra->size);
        memcpy(newkeys, ra->keys, sizeof(uint16_t) * ra->size);
        memcpy(newtypecodes, ra->typecodes, sizeof(uint8_t) * ra->size);
    }
    ra->containers = newcontainers;
    ra->keys = newkeys;
    ra->typecodes = newtypecodes;
    ra->allocation_size = new_capacity;
    roaring_free(oldbigalloc);
    return true;
}